

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O0

ON_wString ON_AddIdSuffixToString(wchar_t *source,wchar_t *separator,ON_UUID id)

{
  ON_UUID id_00;
  ON_wString local_50 [3];
  undefined1 local_31;
  wchar_t *local_30;
  wchar_t *separator_local;
  wchar_t *source_local;
  ON_UUID id_local;
  ON_wString *s;
  
  source_local = (wchar_t *)id.Data4;
  local_30 = id._0_8_;
  local_31 = 0;
  separator_local = separator;
  id_local.Data4 = (uchar  [8])source;
  ON_wString::ON_wString((ON_wString *)source,separator);
  ON_wString::operator+=((ON_wString *)source,local_30);
  id_00.Data4 = (uchar  [8])source_local;
  id_00._0_8_ = local_50;
  ON_IdToString(id_00);
  ON_wString::operator+=((ON_wString *)source,local_50);
  ON_wString::~ON_wString(local_50);
  return (ON_wString)source;
}

Assistant:

ON_DECL
const ON_wString ON_AddIdSuffixToString(
  const wchar_t* source,
  const wchar_t* separator,
  const ON_UUID id
)
{
  ON_wString s(source);
  s += separator;
  s += ON_IdToString(id);
  return s;

}